

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_append(array_container_t *arr,uint16_t pos)

{
  int iVar1;
  _Bool _Var2;
  int32_t capacity;
  uint16_t pos_local;
  array_container_t *arr_local;
  
  iVar1 = arr->capacity;
  _Var2 = array_container_full(arr);
  if (_Var2) {
    array_container_grow(arr,iVar1 + 1,true);
  }
  iVar1 = arr->cardinality;
  arr->cardinality = iVar1 + 1;
  arr->array[iVar1] = pos;
  return;
}

Assistant:

static inline void array_container_append(array_container_t *arr,
                                          uint16_t pos) {
    const int32_t capacity = arr->capacity;

    if (array_container_full(arr)) {
        array_container_grow(arr, capacity + 1, true);
    }

    arr->array[arr->cardinality++] = pos;
}